

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_connection.c
# Opt level: O2

void apx_connection_on_require_port_write
               (void *arg,apx_portInstance_tag *port_instance,uint8_t *data,apx_size_t size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  apx_connection_t *self;
  dtl_dv_t *dv;
  long local_28;
  
  if (port_instance != (apx_portInstance_tag *)0x0 && arg != (void *)0x0) {
    local_28 = 0;
    pthread_mutex_lock((pthread_mutex_t *)((long)arg + 0x58));
    uVar1 = apx_client_read_port_data(*arg,port_instance,&local_28);
    if (uVar1 == 0) {
      lVar2 = apx_portInstance_name(port_instance);
      pthread_mutex_unlock((pthread_mutex_t *)((long)arg + 0x58));
      if ((lVar2 != 0 && local_28 != 0) && (lVar3 = dtl_json_dumps(local_28,0,0), lVar3 != 0)) {
        uVar4 = adt_str_cstr(lVar3);
        printf("\"%s\": %s\n",lVar2,uVar4);
        fflush(_stdout);
        adt_str_delete(lVar3);
      }
      if (local_28 != 0) {
        dtl_dv_dec_ref();
      }
    }
    else {
      printf("apx_client_read_port_data failed with error code %d\n",(ulong)uVar1);
    }
  }
  return;
}

Assistant:

static void apx_connection_on_require_port_write(void* arg, struct apx_portInstance_tag* port_instance, uint8_t const* data, apx_size_t size)
{
   apx_connection_t* self = (apx_connection_t*)arg;
   (void)data;
   (void)size;
   if ( (self != NULL) && (port_instance != NULL) )
   {
      apx_error_t result;
      char const* port_name;
      dtl_dv_t* dv = 0;
      MUTEX_LOCK(self->mutex);
      result = apx_client_read_port_data(self->client, port_instance, &dv);
      if (result != APX_NO_ERROR)
      {
         printf("apx_client_read_port_data failed with error code %d\n", (int)result);
         return;
      }
      port_name = apx_portInstance_name(port_instance);
      MUTEX_UNLOCK(self->mutex);
      if ((dv != 0) && (port_name != 0))
      {
         adt_str_t* value = dtl_json_dumps(dv, 0, false);
         if (value != 0)
         {
            printf("\"%s\": %s\n", port_name, adt_str_cstr(value));
            fflush(stdout);
            adt_str_delete(value);
         }
      }
      if (dv != 0)
      {
         dtl_dec_ref(dv);
      }
   }
}